

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_suite.cpp
# Opt level: O2

void find_key_map(void)

{
  bool v;
  size_type in_RCX;
  long lVar1;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  variable data;
  key_iterator local_5e8;
  key_iterator local_598;
  key_iterator local_548;
  key_iterator local_4f8;
  key_iterator local_4a8;
  key_iterator local_458;
  key_iterator local_408;
  key_iterator local_3b8;
  key_iterator local_368;
  key_iterator local_318;
  key_iterator local_2c8;
  key_iterator local_278;
  key_iterator local_228;
  key_iterator local_1d8;
  key_iterator local_188;
  type local_138 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_d8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_78;
  
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)&local_138[0].__align,(char (*) [6])"alpha",(char (*) [9])"hydrogen");
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[7],_true>
            (&local_d8,(char (*) [6])"bravo",(char (*) [7])"helium");
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[8],_true>
            (&local_78,(char (*) [8])"charlie",(char (*) [8])"lithium");
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            (&data,(basic_map<std::allocator<char>_> *)&local_138[0].__align,init);
  lVar1 = 0xc0;
  do {
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             *)((long)local_138 + lVar1));
    lVar1 = lVar1 + -0x60;
  } while (lVar1 != -0x60);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin(&local_188,&data);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_1d8,&data);
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator,char[9]>
            ((key_iterator *)&local_138[0].__align,&local_188,&local_1d8,(char (*) [9])"hydrogen");
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_5e8,&data);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)&local_138[0].__align,&local_5e8);
  boost::detail::test_impl
            ("std::find(data.key_begin(), data.key_end(), \"hydrogen\") == data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x96,"void find_key_map()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator
            ((key_iterator *)&local_138[0].__align);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin(&local_228,&data);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin(&local_2c8,&data);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_318,&data);
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator,char[6]>
            (&local_278,&local_2c8,&local_318,(char (*) [6])"alpha");
  local_138[0]._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator>
                 (&local_228,&local_278);
  local_5e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.key_begin(), std::find(data.key_begin(), data.key_end(), \"alpha\"))"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x99,"void find_key_map()",local_138,&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_2c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin(&local_368,&data);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin(&local_408,&data);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_458,&data);
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator,char[6]>
            (&local_3b8,&local_408,&local_458,(char (*) [6])"bravo");
  local_138[0]._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator>
                 (&local_368,&local_3b8);
  local_5e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.key_begin(), std::find(data.key_begin(), data.key_end(), \"bravo\"))"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x9c,"void find_key_map()",local_138,&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_3b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin(&local_4a8,&data);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin(&local_548,&data);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_598,&data);
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator,char[8]>
            (&local_4f8,&local_548,&local_598,(char (*) [8])"charlie");
  local_138[0]._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator>
                 (&local_4a8,&local_4f8);
  local_5e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.key_begin(), std::find(data.key_begin(), data.key_end(), \"charlie\"))"
             ,"2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x9f,"void find_key_map()",local_138,&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_4f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_4a8);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  return;
}

Assistant:

void find_key_map()
{
    variable data = map::make(
        {
            {"alpha", "hydrogen"},
            {"bravo", "helium"},
            {"charlie", "lithium"}
        });
    // Iterator dereferences key
    TRIAL_PROTOCOL_TEST(std::find(data.key_begin(), data.key_end(), "hydrogen") == data.key_end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.key_begin(),
                                            std::find(data.key_begin(), data.key_end(), "alpha")),
                              0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.key_begin(),
                                            std::find(data.key_begin(), data.key_end(), "bravo")),
                              1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.key_begin(),
                                            std::find(data.key_begin(), data.key_end(), "charlie")),
                              2);
}